

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::GetContactPoint
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,
          ChVector<double> *loc_point,ChState *state_x)

{
  double dVar1;
  double dVar2;
  ChVector<double> *v;
  double s3;
  double s2;
  ChVector<double> A1;
  ChVector<double> A2;
  ChVector<double> local_a8;
  ChState *local_90;
  undefined8 local_88;
  long local_78;
  ChVector<double> A3;
  ChVector<double> local_48;
  
  local_48.m_data[0] = loc_point->m_data[0];
  local_48.m_data[1] = loc_point->m_data[1];
  local_48.m_data[2] = loc_point->m_data[2];
  local_a8.m_data[2] = 0.0;
  local_a8.m_data._0_16_ = ZEXT816(0) << 0x20;
  collision::utils::PointTriangleDistance
            (&local_48,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,(bool *)&A1,&local_a8);
  dVar2 = s2;
  dVar1 = s3;
  local_a8.m_data[0] =
       (double)(state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_78 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_a8.m_data[1] = 1.48219693752374e-323;
  local_88 = 0;
  if (2 < local_78) {
    local_90 = state_x;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&A1,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_a8,(type *)0x0);
    local_78 = (state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_a8.m_data[0] =
         (double)((state_x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 7);
    local_a8.m_data[1] = 1.48219693752374e-323;
    local_88 = 7;
    if (9 < local_78) {
      local_90 = state_x;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&A2,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_a8,(type *)0x0);
      local_78 = (state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_a8.m_data[0] =
           (double)((state_x->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + 0xe);
      local_a8.m_data[1] = 1.48219693752374e-323;
      local_88 = 0xe;
      if (0x10 < local_78) {
        dVar1 = (1.0 - dVar2) - dVar1;
        local_90 = state_x;
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&A3,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_a8,(type *)0x0);
        __return_storage_ptr__->m_data[0] =
             dVar1 * A1.m_data[0] + s2 * A2.m_data[0] + s3 * A3.m_data[0];
        __return_storage_ptr__->m_data[1] =
             dVar1 * A1.m_data[1] + s2 * A2.m_data[1] + s3 * A3.m_data[1];
        __return_storage_ptr__->m_data[2] =
             dVar1 * A1.m_data[2] + s2 * A2.m_data[2] + s3 * A3.m_data[2];
        return __return_storage_ptr__;
      }
    }
  }
  local_a8.m_data[1] = 1.48219693752374e-323;
  local_90 = state_x;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ChVector<> ChContactTriangleXYZROT::GetContactPoint(const ChVector<>& loc_point, const ChState& state_x) {
    // Note: because the reference coordinate system for a ChContactTriangleXYZROT is the identity,
    // the given point loc_point is actually expressed in the global frame. In this case, we
    // calculate the output point here by assuming that its barycentric coordinates do not change
    // with a change in the states of this object.
    double s2, s3;
    ComputeUVfromP(loc_point, s2, s3);
    double s1 = 1 - s2 - s3;

    ChVector<> A1(state_x.segment(0, 3));
    ChVector<> A2(state_x.segment(7, 3));
    ChVector<> A3(state_x.segment(14, 3));

    return s1 * A1 + s2 * A2 + s3 * A3;
}